

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_1U,_4U>::Init(WavingSketch<8U,_1U,_4U> *this,Data<4U> *item,uint time)

{
  byte bVar1;
  ulong uVar2;
  uint position;
  uint uVar3;
  uint i;
  uint num;
  bool bVar4;
  
  if (this->record < time) {
    this->record = time;
    memset(*(void **)(this->bitset + 8),0,(ulong)(*(uint *)this->bitset >> 3) + 1);
  }
  bVar4 = true;
  for (num = 0; num < this->HASH_NUM; num = num + 1) {
    uVar3 = Data<4U>::Hash(item,num);
    uVar2 = (ulong)uVar3 % (ulong)this->LENGTH;
    bVar1 = *(byte *)(*(long *)(this->bitset + 8) + (uVar2 >> 3));
    if ((bVar1 >> ((uint)uVar2 & 7) & 1) == 0) {
      *(byte *)(*(long *)(this->bitset + 8) + (uVar2 >> 3)) = (byte)(1 << ((byte)uVar2 & 7)) | bVar1
      ;
      bVar4 = false;
    }
  }
  if (bVar4) {
    return;
  }
  (**(this->super_Abstract<4U>)._vptr_Abstract)(this,item);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item, uint time) {
		if (time > record) {
			record = time;
			bitset->Clear();
		}

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = item.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(item);
	}